

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O1

StorageIndex *
duckdb::TransformStorageIndex(StorageIndex *__return_storage_ptr__,ColumnIndex *column_id)

{
  pointer pCVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer column_id_00;
  vector<duckdb::StorageIndex,_true> result;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_88;
  StorageIndex local_68;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_48;
  
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_id_00 = (column_id->child_indexes).
                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (column_id->child_indexes).
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (column_id_00 != pCVar1) {
    do {
      TransformStorageIndex(&local_68,column_id_00);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::
      emplace_back<duckdb::StorageIndex>(&local_88,&local_68);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&local_68.child_indexes.
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
      column_id_00 = column_id_00 + 1;
    } while (column_id_00 != pCVar1);
  }
  pSVar4 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pSVar3 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->index = column_id->index;
  (__return_storage_ptr__->child_indexes).
  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = pSVar2;
  (__return_storage_ptr__->child_indexes).
  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar3;
  (__return_storage_ptr__->child_indexes).
  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSVar4;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_48);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static StorageIndex TransformStorageIndex(const ColumnIndex &column_id) {
	vector<StorageIndex> result;
	for (auto &child_id : column_id.GetChildIndexes()) {
		result.push_back(TransformStorageIndex(child_id));
	}
	return StorageIndex(column_id.GetPrimaryIndex(), std::move(result));
}